

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gait_plan.c
# Opt level: O2

Matrix_t Calc_GaitTrajPoint_Walk(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  Robot_MatrixGroup_t *pRVar6;
  Robot_MatrixGroup_t *pRVar7;
  int iVar8;
  int iVar9;
  float *pMatrix;
  float *pfVar10;
  float *pfVar11;
  undefined8 uVar12;
  Robot_MatrixGroup_t *pRVar13;
  Robot_MatrixGroup_t *pRVar14;
  Matrix_t *pMVar15;
  undefined8 in_R9;
  Robot_MatrixGroup_t *pRVar16;
  Robot_MatrixGroup_t *pRVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  Matrix_t MVar22;
  Matrix_t MVar23;
  Matrix_t MVar24;
  Matrix_t sMatrix;
  Matrix_t sMatrix_00;
  Matrix_t sMatrix_01;
  Matrix_t sMatrix_02;
  Matrix_t sMatrix_03;
  Matrix_t sMatrix_04;
  Matrix_t sMatrix_05;
  Matrix_t sMatrix_06;
  Matrix_t sMatrix_07;
  Matrix_t *local_98;
  Matrix_t *local_90;
  
  pMatrix = (float *)malloc(0x30);
  fVar21 = (sRobot_MotionPara.Phase_LF / sRobot_MotionPara.PhaseTotal) * sRobot_MotionPara.Cycle;
  iVar8 = sRobot_MotionPara.Span_Z / 2;
  if (sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio <= sRobot_MotionPara.Phase_LF) {
    fVar19 = polyval(Coeff_X.pMatrix,4,fVar21 - SupportingTime_Walk);
    iVar9 = sRobot_MotionPara.Span_X / 2;
    fVar20 = polyval(Coeff_Y.pMatrix,4,fVar21 - SupportingTime_Walk);
    dVar5 = (double)sRobot_MotionPara.Span_Y;
    dVar4 = cos((double)(((fVar21 - SupportingTime_Walk) * 6.2831855) / SwingTime_Walk));
    fVar18 = sRobot_MotionPara.Span_W;
    fVar21 = polyval(Coeff_W.pMatrix,4,fVar21 - SupportingTime_Walk);
    MVar22 = SE3_Rz(((fVar21 * fVar18) / 3.1415927) * 180.0);
    pfVar10 = MVar22.pMatrix;
    MVar23.row = Plane2Body.row;
    MVar23.column = Plane2Body.column;
    MVar23._10_6_ = Plane2Body._10_6_;
    MVar23.pMatrix = Plane2Body.pMatrix;
    MVar23 = Inv4(MVar23);
    pfVar11 = MVar23.pMatrix;
    Zero2Swing_Ending =
         SE3_T(fVar20 * (float)iVar9,(float)((1.0 - dVar4) * dVar5 * 0.5),(float)iVar8 * fVar19);
    local_98 = &Zero2Swing_Ending;
    Position2Swing_Ending.LF =
         MatrixMultiply(2,Position2Zero.LF.pMatrix,Position2Zero.LF._8_8_,Zero2Swing_Ending.pMatrix,
                        Zero2Swing_Ending._8_8_);
    pRVar16 = &Position2Swing_Ending;
    Plane2Swing_Ending.LF =
         MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,
                        Position2Swing_Ending.LF.pMatrix,Position2Swing_Ending.LF._8_8_);
    pRVar13 = &Plane2Swing_Ending;
    MVar22 = MatrixMultiply(3,pfVar10,MVar22._8_8_,pfVar11,MVar23._8_8_,in_R9,
                            (undefined1  [16])Plane2Swing_Ending.LF);
    pRVar17 = &Leg2Swing_Ending;
    pRVar14 = &Body2Swing_Ending;
  }
  else {
    fVar18 = (fVar21 * -4.0) / sRobot_MotionPara.Cycle + 1.0;
    iVar9 = sRobot_MotionPara.Span_X / 2;
    MVar22 = SE3_Rz(((fVar18 * sRobot_MotionPara.Span_W) / 3.1415927) * 180.0);
    pfVar10 = MVar22.pMatrix;
    MVar24.row = Plane2Body.row;
    MVar24.column = Plane2Body.column;
    MVar24._10_6_ = Plane2Body._10_6_;
    MVar24.pMatrix = Plane2Body.pMatrix;
    MVar23 = Inv4(MVar24);
    pfVar11 = MVar23.pMatrix;
    Zero2Supporting_Ending = SE3_T((float)iVar9 * fVar18,fVar21 * 0.0,(float)iVar8 * fVar18);
    local_98 = &Zero2Supporting_Ending;
    Position2Supporting_Ending.LF =
         MatrixMultiply(2,Position2Zero.LF.pMatrix,Position2Zero.LF._8_8_,
                        Zero2Supporting_Ending.pMatrix,Zero2Supporting_Ending._8_8_);
    pRVar16 = &Position2Supporting_Ending;
    Plane2Supporting_Ending.LF =
         MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,
                        Position2Supporting_Ending.LF.pMatrix,Position2Supporting_Ending.LF._8_8_);
    pRVar13 = &Plane2Supporting_Ending;
    MVar22 = MatrixMultiply(3,pfVar10,MVar22._8_8_,pfVar11,MVar23._8_8_,in_R9,
                            (undefined1  [16])Plane2Supporting_Ending.LF);
    pRVar17 = &Leg2Supporting_Ending;
    pRVar14 = &Body2Supporting_Ending;
  }
  pRVar14->LF = MVar22;
  free(local_98->pMatrix);
  free((pRVar16->LF).pMatrix);
  free((pRVar13->LF).pMatrix);
  free(pfVar10);
  free(pfVar11);
  MVar22.row = Body2Leg.LF.row;
  MVar22.column = Body2Leg.LF.column;
  MVar22._10_6_ = Body2Leg.LF._10_6_;
  MVar22.pMatrix = Body2Leg.LF.pMatrix;
  MVar22 = Inv4(MVar22);
  uVar12._0_1_ = (pRVar14->LF).row;
  uVar12._1_1_ = (pRVar14->LF).column;
  uVar12._2_6_ = *(undefined6 *)&(pRVar14->LF).field_0xa;
  MVar23 = MatrixMultiply(2,MVar22.pMatrix,MVar22._8_8_,(pRVar14->LF).pMatrix,uVar12);
  pRVar17->LF = MVar23;
  free(MVar22.pMatrix);
  free((pRVar14->LF).pMatrix);
  pfVar10 = (pRVar17->LF).pMatrix;
  *pMatrix = pfVar10[3];
  pMatrix[1] = pfVar10[7];
  pMatrix[2] = pfVar10[0xb];
  free(pfVar10);
  fVar21 = (sRobot_MotionPara.Phase_LH / sRobot_MotionPara.PhaseTotal) * sRobot_MotionPara.Cycle;
  iVar8 = sRobot_MotionPara.Span_Z / 2;
  if (sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio <= sRobot_MotionPara.Phase_LH) {
    fVar19 = polyval(Coeff_X.pMatrix,4,fVar21 - SupportingTime_Walk);
    iVar9 = sRobot_MotionPara.Span_X / 2;
    fVar20 = polyval(Coeff_Y.pMatrix,4,fVar21 - SupportingTime_Walk);
    dVar5 = (double)sRobot_MotionPara.Span_Y;
    dVar4 = cos((double)(((fVar21 - SupportingTime_Walk) * 6.2831855) / SwingTime_Walk));
    fVar18 = sRobot_MotionPara.Span_W;
    fVar21 = polyval(Coeff_W.pMatrix,4,fVar21 - SupportingTime_Walk);
    MVar22 = SE3_Rz(((fVar21 * fVar18) / 3.1415927) * 180.0);
    pfVar10 = MVar22.pMatrix;
    sMatrix_00.row = Plane2Body.row;
    sMatrix_00.column = Plane2Body.column;
    sMatrix_00._10_6_ = Plane2Body._10_6_;
    sMatrix_00.pMatrix = Plane2Body.pMatrix;
    MVar23 = Inv4(sMatrix_00);
    pfVar11 = MVar23.pMatrix;
    MVar24 = SE3_T(fVar20 * (float)iVar9,(float)((1.0 - dVar4) * dVar5 * -0.5),
                   (float)iVar8 * -fVar19);
    local_98 = &Zero2Swing_Ending;
    Zero2Swing_Ending = MVar24;
    Position2Swing_Ending.LH =
         MatrixMultiply(2,Position2Zero.LH.pMatrix,Position2Zero.LH._8_8_,MVar24.pMatrix,
                        MVar24._8_8_);
    pRVar13 = &Position2Swing_Ending;
    Plane2Swing_Ending.LH =
         MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,
                        Position2Swing_Ending.LH.pMatrix,Position2Swing_Ending.LH._8_8_);
    pRVar14 = &Plane2Swing_Ending;
    MVar22 = MatrixMultiply(3,pfVar10,MVar22._8_8_,pfVar11,MVar23._8_8_,in_R9,
                            (undefined1  [16])Plane2Swing_Ending.LH);
    pRVar7 = &Leg2Swing_Ending;
    pRVar6 = &Leg2Swing_Ending;
    pRVar17 = &Body2Swing_Ending;
    pRVar16 = &Body2Swing_Ending;
  }
  else {
    fVar18 = (fVar21 * -4.0) / sRobot_MotionPara.Cycle + 1.0;
    iVar9 = sRobot_MotionPara.Span_X / 2;
    MVar22 = SE3_Rz(((sRobot_MotionPara.Span_W * fVar18) / 3.1415927) * 180.0);
    pfVar10 = MVar22.pMatrix;
    sMatrix.row = Plane2Body.row;
    sMatrix.column = Plane2Body.column;
    sMatrix._10_6_ = Plane2Body._10_6_;
    sMatrix.pMatrix = Plane2Body.pMatrix;
    MVar23 = Inv4(sMatrix);
    pfVar11 = MVar23.pMatrix;
    MVar24 = SE3_T((float)iVar9 * fVar18,fVar21 * -0.0,-fVar18 * (float)iVar8);
    local_98 = &Zero2Supporting_Ending;
    Zero2Supporting_Ending = MVar24;
    Position2Supporting_Ending.LH =
         MatrixMultiply(2,Position2Zero.LH.pMatrix,Position2Zero.LH._8_8_,MVar24.pMatrix,
                        MVar24._8_8_);
    pRVar13 = &Position2Supporting_Ending;
    Plane2Supporting_Ending.LH =
         MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,
                        Position2Supporting_Ending.LH.pMatrix,Position2Supporting_Ending.LH._8_8_);
    pRVar14 = &Plane2Supporting_Ending;
    MVar22 = MatrixMultiply(3,pfVar10,MVar22._8_8_,pfVar11,MVar23._8_8_,in_R9,
                            (undefined1  [16])Plane2Supporting_Ending.LH);
    pRVar7 = &Leg2Supporting_Ending;
    pRVar6 = &Leg2Supporting_Ending;
    pRVar17 = &Body2Supporting_Ending;
    pRVar16 = &Body2Supporting_Ending;
  }
  local_90 = &pRVar13->LH;
  pMVar15 = &pRVar16->LH;
  uVar12 = MVar22._8_8_;
  pMVar15->pMatrix = MVar22.pMatrix;
  (pRVar17->LH).row = (char)uVar12;
  (pRVar17->LH).column = (char)((ulong)uVar12 >> 8);
  *(int6 *)&(pRVar17->LH).field_0xa = (int6)((ulong)uVar12 >> 0x10);
  free(local_98->pMatrix);
  free(local_90->pMatrix);
  free((pRVar14->LH).pMatrix);
  free(pfVar10);
  free(pfVar11);
  sMatrix_01.row = Body2Leg.LH.row;
  sMatrix_01.column = Body2Leg.LH.column;
  sMatrix_01._10_6_ = Body2Leg.LH._10_6_;
  sMatrix_01.pMatrix = Body2Leg.LH.pMatrix;
  MVar22 = Inv4(sMatrix_01);
  uVar1._0_1_ = (pRVar17->LH).row;
  uVar1._1_1_ = (pRVar17->LH).column;
  uVar1._2_6_ = *(undefined6 *)&(pRVar17->LH).field_0xa;
  MVar23 = MatrixMultiply(2,MVar22.pMatrix,MVar22._8_8_,pMVar15->pMatrix,uVar1);
  uVar12 = MVar23._8_8_;
  (pRVar6->LH).pMatrix = MVar23.pMatrix;
  (pRVar7->LH).row = (char)uVar12;
  (pRVar7->LH).column = (char)((ulong)uVar12 >> 8);
  *(int6 *)&(pRVar7->LH).field_0xa = (int6)((ulong)uVar12 >> 0x10);
  free(MVar22.pMatrix);
  free(pMVar15->pMatrix);
  pfVar10 = (pRVar6->LH).pMatrix;
  pMatrix[9] = pfVar10[3];
  pMatrix[10] = pfVar10[7];
  pMatrix[0xb] = pfVar10[0xb];
  free(pfVar10);
  fVar21 = (sRobot_MotionPara.Phase_RH / sRobot_MotionPara.PhaseTotal) * sRobot_MotionPara.Cycle;
  iVar8 = sRobot_MotionPara.Span_Z / 2;
  if (sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio <= sRobot_MotionPara.Phase_RH) {
    fVar19 = polyval(Coeff_X.pMatrix,4,fVar21 - SupportingTime_Walk);
    iVar9 = sRobot_MotionPara.Span_X / 2;
    fVar20 = polyval(Coeff_Y.pMatrix,4,fVar21 - SupportingTime_Walk);
    dVar5 = (double)sRobot_MotionPara.Span_Y;
    dVar4 = cos((double)(((fVar21 - SupportingTime_Walk) * 6.2831855) / SwingTime_Walk));
    fVar18 = sRobot_MotionPara.Span_W;
    fVar21 = polyval(Coeff_W.pMatrix,4,fVar21 - SupportingTime_Walk);
    MVar22 = SE3_Rz(((fVar21 * fVar18) / 3.1415927) * 180.0);
    pfVar10 = MVar22.pMatrix;
    sMatrix_03.row = Plane2Body.row;
    sMatrix_03.column = Plane2Body.column;
    sMatrix_03._10_6_ = Plane2Body._10_6_;
    sMatrix_03.pMatrix = Plane2Body.pMatrix;
    MVar23 = Inv4(sMatrix_03);
    pfVar11 = MVar23.pMatrix;
    MVar24 = SE3_T(-fVar20 * (float)iVar9,(float)((1.0 - dVar4) * dVar5 * 0.5),
                   (float)iVar8 * -fVar19);
    local_98 = &Zero2Swing_Ending;
    Zero2Swing_Ending = MVar24;
    Position2Swing_Ending.RH =
         MatrixMultiply(2,Position2Zero.RH.pMatrix,Position2Zero.RH._8_8_,MVar24.pMatrix,
                        MVar24._8_8_);
    pRVar13 = &Position2Swing_Ending;
    Plane2Swing_Ending.RH =
         MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,
                        Position2Swing_Ending.RH.pMatrix,Position2Swing_Ending.RH._8_8_);
    pRVar14 = &Plane2Swing_Ending;
    MVar22 = MatrixMultiply(3,pfVar10,MVar22._8_8_,pfVar11,MVar23._8_8_,in_R9,
                            (undefined1  [16])Plane2Swing_Ending.RH);
    pRVar7 = &Leg2Swing_Ending;
    pRVar6 = &Leg2Swing_Ending;
    pRVar17 = &Body2Swing_Ending;
    pRVar16 = &Body2Swing_Ending;
  }
  else {
    fVar18 = (fVar21 * -4.0) / sRobot_MotionPara.Cycle + 1.0;
    iVar9 = sRobot_MotionPara.Span_X / 2;
    MVar22 = SE3_Rz(((sRobot_MotionPara.Span_W * fVar18) / 3.1415927) * 180.0);
    pfVar10 = MVar22.pMatrix;
    sMatrix_02.row = Plane2Body.row;
    sMatrix_02.column = Plane2Body.column;
    sMatrix_02._10_6_ = Plane2Body._10_6_;
    sMatrix_02.pMatrix = Plane2Body.pMatrix;
    MVar23 = Inv4(sMatrix_02);
    pfVar11 = MVar23.pMatrix;
    fVar18 = -fVar18;
    MVar24 = SE3_T((float)iVar9 * fVar18,fVar21 * 0.0,fVar18 * (float)iVar8);
    local_98 = &Zero2Supporting_Ending;
    Zero2Supporting_Ending = MVar24;
    Position2Supporting_Ending.RH =
         MatrixMultiply(2,Position2Zero.RH.pMatrix,Position2Zero.RH._8_8_,MVar24.pMatrix,
                        MVar24._8_8_);
    pRVar13 = &Position2Supporting_Ending;
    Plane2Supporting_Ending.RH =
         MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,
                        Position2Supporting_Ending.RH.pMatrix,Position2Supporting_Ending.RH._8_8_);
    pRVar14 = &Plane2Supporting_Ending;
    MVar22 = MatrixMultiply(3,pfVar10,MVar22._8_8_,pfVar11,MVar23._8_8_,in_R9,
                            (undefined1  [16])Plane2Supporting_Ending.RH);
    pRVar7 = &Leg2Supporting_Ending;
    pRVar6 = &Leg2Supporting_Ending;
    pRVar17 = &Body2Supporting_Ending;
    pRVar16 = &Body2Supporting_Ending;
  }
  local_90 = &pRVar13->RH;
  pMVar15 = &pRVar16->RH;
  uVar12 = MVar22._8_8_;
  pMVar15->pMatrix = MVar22.pMatrix;
  (pRVar17->RH).row = (char)uVar12;
  (pRVar17->RH).column = (char)((ulong)uVar12 >> 8);
  *(int6 *)&(pRVar17->RH).field_0xa = (int6)((ulong)uVar12 >> 0x10);
  free(local_98->pMatrix);
  free(local_90->pMatrix);
  free((pRVar14->RH).pMatrix);
  free(pfVar10);
  free(pfVar11);
  sMatrix_04.row = Body2Leg.RH.row;
  sMatrix_04.column = Body2Leg.RH.column;
  sMatrix_04._10_6_ = Body2Leg.RH._10_6_;
  sMatrix_04.pMatrix = Body2Leg.RH.pMatrix;
  MVar22 = Inv4(sMatrix_04);
  uVar2._0_1_ = (pRVar17->RH).row;
  uVar2._1_1_ = (pRVar17->RH).column;
  uVar2._2_6_ = *(undefined6 *)&(pRVar17->RH).field_0xa;
  MVar23 = MatrixMultiply(2,MVar22.pMatrix,MVar22._8_8_,pMVar15->pMatrix,uVar2);
  uVar12 = MVar23._8_8_;
  (pRVar6->RH).pMatrix = MVar23.pMatrix;
  (pRVar7->RH).row = (char)uVar12;
  (pRVar7->RH).column = (char)((ulong)uVar12 >> 8);
  *(int6 *)&(pRVar7->RH).field_0xa = (int6)((ulong)uVar12 >> 0x10);
  free(MVar22.pMatrix);
  free(pMVar15->pMatrix);
  pfVar10 = (pRVar6->RH).pMatrix;
  pMatrix[3] = pfVar10[3];
  pMatrix[4] = pfVar10[7];
  pMatrix[5] = pfVar10[0xb];
  free(pfVar10);
  fVar21 = (sRobot_MotionPara.Phase_RF / sRobot_MotionPara.PhaseTotal) * sRobot_MotionPara.Cycle;
  iVar8 = sRobot_MotionPara.Span_Z / 2;
  if (sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio <= sRobot_MotionPara.Phase_RF) {
    fVar19 = polyval(Coeff_X.pMatrix,4,fVar21 - SupportingTime_Walk);
    iVar9 = sRobot_MotionPara.Span_X / 2;
    fVar20 = polyval(Coeff_Y.pMatrix,4,fVar21 - SupportingTime_Walk);
    dVar5 = (double)sRobot_MotionPara.Span_Y;
    dVar4 = cos((double)(((fVar21 - SupportingTime_Walk) * 6.2831855) / SwingTime_Walk));
    fVar18 = sRobot_MotionPara.Span_W;
    fVar21 = polyval(Coeff_W.pMatrix,4,fVar21 - SupportingTime_Walk);
    MVar22 = SE3_Rz(((fVar21 * fVar18) / 3.1415927) * 180.0);
    pfVar10 = MVar22.pMatrix;
    sMatrix_06.row = Plane2Body.row;
    sMatrix_06.column = Plane2Body.column;
    sMatrix_06._10_6_ = Plane2Body._10_6_;
    sMatrix_06.pMatrix = Plane2Body.pMatrix;
    MVar23 = Inv4(sMatrix_06);
    pfVar11 = MVar23.pMatrix;
    MVar24 = SE3_T(-fVar20 * (float)iVar9,(float)((1.0 - dVar4) * dVar5 * -0.5),
                   (float)iVar8 * fVar19);
    local_98 = &Zero2Swing_Ending;
    Zero2Swing_Ending = MVar24;
    Position2Swing_Ending.RF =
         MatrixMultiply(2,Position2Zero.RF.pMatrix,Position2Zero.RF._8_8_,MVar24.pMatrix,
                        MVar24._8_8_);
    pRVar13 = &Position2Swing_Ending;
    Plane2Swing_Ending.RF =
         MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,
                        Position2Swing_Ending.RF.pMatrix,Position2Swing_Ending.RF._8_8_);
    pRVar14 = &Plane2Swing_Ending;
    MVar22 = MatrixMultiply(3,pfVar10,MVar22._8_8_,pfVar11,MVar23._8_8_,in_R9,
                            (undefined1  [16])Plane2Swing_Ending.RF);
    pRVar7 = &Leg2Swing_Ending;
    pRVar6 = &Leg2Swing_Ending;
    pRVar17 = &Body2Swing_Ending;
    pRVar16 = &Body2Swing_Ending;
  }
  else {
    fVar18 = (fVar21 * -4.0) / sRobot_MotionPara.Cycle + 1.0;
    iVar9 = sRobot_MotionPara.Span_X / 2;
    MVar22 = SE3_Rz(((sRobot_MotionPara.Span_W * fVar18) / 3.1415927) * 180.0);
    pfVar10 = MVar22.pMatrix;
    sMatrix_05.row = Plane2Body.row;
    sMatrix_05.column = Plane2Body.column;
    sMatrix_05._10_6_ = Plane2Body._10_6_;
    sMatrix_05.pMatrix = Plane2Body.pMatrix;
    MVar23 = Inv4(sMatrix_05);
    pfVar11 = MVar23.pMatrix;
    MVar24 = SE3_T(-fVar18 * (float)iVar9,fVar21 * -0.0,(float)iVar8 * fVar18);
    local_98 = &Zero2Supporting_Ending;
    Zero2Supporting_Ending = MVar24;
    Position2Supporting_Ending.RF =
         MatrixMultiply(2,Position2Zero.RF.pMatrix,Position2Zero.RF._8_8_,MVar24.pMatrix,
                        MVar24._8_8_);
    pRVar13 = &Position2Supporting_Ending;
    Plane2Supporting_Ending.RF =
         MatrixMultiply(2,Plane2Position.pMatrix,Plane2Position._8_8_,
                        Position2Supporting_Ending.RF.pMatrix,Position2Supporting_Ending.RF._8_8_);
    pRVar14 = &Plane2Supporting_Ending;
    MVar22 = MatrixMultiply(3,pfVar10,MVar22._8_8_,pfVar11,MVar23._8_8_,in_R9,
                            (undefined1  [16])Plane2Supporting_Ending.RF);
    pRVar7 = &Leg2Supporting_Ending;
    pRVar6 = &Leg2Supporting_Ending;
    pRVar17 = &Body2Supporting_Ending;
    pRVar16 = &Body2Supporting_Ending;
  }
  local_90 = &pRVar13->RF;
  pMVar15 = &pRVar16->RF;
  uVar12 = MVar22._8_8_;
  pMVar15->pMatrix = MVar22.pMatrix;
  (pRVar17->RF).row = (char)uVar12;
  (pRVar17->RF).column = (char)((ulong)uVar12 >> 8);
  *(int6 *)&(pRVar17->RF).field_0xa = (int6)((ulong)uVar12 >> 0x10);
  free(local_98->pMatrix);
  free(local_90->pMatrix);
  free((pRVar14->RF).pMatrix);
  free(pfVar10);
  free(pfVar11);
  sMatrix_07.row = Body2Leg.RF.row;
  sMatrix_07.column = Body2Leg.RF.column;
  sMatrix_07._10_6_ = Body2Leg.RF._10_6_;
  sMatrix_07.pMatrix = Body2Leg.RF.pMatrix;
  MVar22 = Inv4(sMatrix_07);
  uVar3._0_1_ = (pRVar17->RF).row;
  uVar3._1_1_ = (pRVar17->RF).column;
  uVar3._2_6_ = *(undefined6 *)&(pRVar17->RF).field_0xa;
  MVar23 = MatrixMultiply(2,MVar22.pMatrix,MVar22._8_8_,pMVar15->pMatrix,uVar3);
  uVar12 = MVar23._8_8_;
  (pRVar6->RF).pMatrix = MVar23.pMatrix;
  (pRVar7->RF).row = (char)uVar12;
  (pRVar7->RF).column = (char)((ulong)uVar12 >> 8);
  *(int6 *)&(pRVar7->RF).field_0xa = (int6)((ulong)uVar12 >> 0x10);
  free(MVar22.pMatrix);
  free(pMVar15->pMatrix);
  pfVar10 = (pRVar6->RF).pMatrix;
  pMatrix[6] = pfVar10[3];
  pMatrix[7] = pfVar10[7];
  pMatrix[8] = pfVar10[0xb];
  free(pfVar10);
  MVar22 = Arr2Mat(pMatrix,'\x04','\x03');
  return MVar22;
}

Assistant:

Matrix_t Calc_GaitTrajPoint_Walk(void)
{
	float t;
	float *ResultArray = (float *)malloc(sizeof(float) * 4 * 3);
	float Zero2Supporting_Ending_PosX, Zero2Supporting_Ending_PosZ, Zero2Supporting_Ending_PosY;
	float Zero2Swing_Ending_PosX, Zero2Swing_Ending_PosZ, Zero2Swing_Ending_PosY;
	float Theta_Supporting, Theta_Swing;
	Matrix_t MatrixRotation_Z, InverseMatrix;

	t = sRobot_MotionPara.Phase_LF / sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.Cycle;
	if (sRobot_MotionPara.Phase_LF < sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio)
	{
		Zero2Supporting_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosX = sRobot_MotionPara.Span_X / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosY = 0 * t;
		Theta_Supporting = sRobot_MotionPara.Span_W * (1 - 4 * t / sRobot_MotionPara.Cycle);

		MatrixRotation_Z = SE3_Rz(Theta_Supporting / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Supporting_Ending = SE3_T(Zero2Supporting_Ending_PosX, Zero2Supporting_Ending_PosY, Zero2Supporting_Ending_PosZ);
		Position2Supporting_Ending.LF = MatrixMultiply(2, Position2Zero.LF, Zero2Supporting_Ending);
		Plane2Supporting_Ending.LF = MatrixMultiply(2, Plane2Position, Position2Supporting_Ending.LF);
		Body2Supporting_Ending.LF = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Supporting_Ending.LF);
		free(Zero2Supporting_Ending.pMatrix);
		free(Position2Supporting_Ending.LF.pMatrix);
		free(Plane2Supporting_Ending.LF.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.LF);
		Leg2Supporting_Ending.LF = MatrixMultiply(2, InverseMatrix, Body2Supporting_Ending.LF);
		free(InverseMatrix.pMatrix);
		free(Body2Supporting_Ending.LF.pMatrix);

		*(ResultArray + 0 * 3 + 0) = *(Leg2Supporting_Ending.LF.pMatrix + 0 * 4 + 3);
		*(ResultArray + 0 * 3 + 1) = *(Leg2Supporting_Ending.LF.pMatrix + 1 * 4 + 3);
		*(ResultArray + 0 * 3 + 2) = *(Leg2Supporting_Ending.LF.pMatrix + 2 * 4 + 3);

		free(Leg2Supporting_Ending.LF.pMatrix);
	}
	else
	{
		Zero2Swing_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * polyval(Coeff_X.pMatrix, 4, (t - SupportingTime_Walk));
		Zero2Swing_Ending_PosX = sRobot_MotionPara.Span_X / 2 * polyval(Coeff_Y.pMatrix, 4, (t - SupportingTime_Walk));
		Zero2Swing_Ending_PosY = sRobot_MotionPara.Span_Y * (1 - cos(2 * PI * (t - SupportingTime_Walk) / SwingTime_Walk)) / 2;
		Theta_Swing = sRobot_MotionPara.Span_W * polyval(Coeff_W.pMatrix, 4, (t - SupportingTime_Walk));

		MatrixRotation_Z = SE3_Rz(Theta_Swing / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Swing_Ending = SE3_T(Zero2Swing_Ending_PosX, Zero2Swing_Ending_PosY, Zero2Swing_Ending_PosZ);
		Position2Swing_Ending.LF = MatrixMultiply(2, Position2Zero.LF, Zero2Swing_Ending);
		Plane2Swing_Ending.LF = MatrixMultiply(2, Plane2Position, Position2Swing_Ending.LF);
		Body2Swing_Ending.LF = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Swing_Ending.LF);
		free(Zero2Swing_Ending.pMatrix);
		free(Position2Swing_Ending.LF.pMatrix);
		free(Plane2Swing_Ending.LF.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.LF);
		Leg2Swing_Ending.LF = MatrixMultiply(2, InverseMatrix, Body2Swing_Ending.LF);
		free(InverseMatrix.pMatrix);
		free(Body2Swing_Ending.LF.pMatrix);

		*(ResultArray + 0 * 3 + 0) = *(Leg2Swing_Ending.LF.pMatrix + 0 * 4 + 3);
		*(ResultArray + 0 * 3 + 1) = *(Leg2Swing_Ending.LF.pMatrix + 1 * 4 + 3);
		*(ResultArray + 0 * 3 + 2) = *(Leg2Swing_Ending.LF.pMatrix + 2 * 4 + 3);

		free(Leg2Swing_Ending.LF.pMatrix);
	}

	t = sRobot_MotionPara.Phase_LH / sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.Cycle;
	if (sRobot_MotionPara.Phase_LH < sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio)
	{
		Zero2Supporting_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosX = sRobot_MotionPara.Span_X / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosY = 0 * t;
		Theta_Supporting = sRobot_MotionPara.Span_W * (1 - 4 * t / sRobot_MotionPara.Cycle);

		MatrixRotation_Z = SE3_Rz(Theta_Supporting / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Supporting_Ending = SE3_T(Zero2Supporting_Ending_PosX, -Zero2Supporting_Ending_PosY, -Zero2Supporting_Ending_PosZ);
		Position2Supporting_Ending.LH = MatrixMultiply(2, Position2Zero.LH, Zero2Supporting_Ending);
		Plane2Supporting_Ending.LH = MatrixMultiply(2, Plane2Position, Position2Supporting_Ending.LH);
		Body2Supporting_Ending.LH = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Supporting_Ending.LH);
		free(Zero2Supporting_Ending.pMatrix);
		free(Position2Supporting_Ending.LH.pMatrix);
		free(Plane2Supporting_Ending.LH.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.LH);
		Leg2Supporting_Ending.LH = MatrixMultiply(2, InverseMatrix, Body2Supporting_Ending.LH);
		free(InverseMatrix.pMatrix);
		free(Body2Supporting_Ending.LH.pMatrix);

		*(ResultArray + 3 * 3 + 0) = *(Leg2Supporting_Ending.LH.pMatrix + 0 * 4 + 3);
		*(ResultArray + 3 * 3 + 1) = *(Leg2Supporting_Ending.LH.pMatrix + 1 * 4 + 3);
		*(ResultArray + 3 * 3 + 2) = *(Leg2Supporting_Ending.LH.pMatrix + 2 * 4 + 3);

		free(Leg2Supporting_Ending.LH.pMatrix);
	}
	else
	{
		Zero2Swing_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * polyval(Coeff_X.pMatrix, 4, (t - SupportingTime_Walk));
		Zero2Swing_Ending_PosX = sRobot_MotionPara.Span_X / 2 * polyval(Coeff_Y.pMatrix, 4, (t - SupportingTime_Walk));
		Zero2Swing_Ending_PosY = sRobot_MotionPara.Span_Y * (1 - cos(2 * PI * (t - SupportingTime_Walk) / SwingTime_Walk)) / 2;
		Theta_Swing = sRobot_MotionPara.Span_W * polyval(Coeff_W.pMatrix, 4, (t - SupportingTime_Walk));

		MatrixRotation_Z = SE3_Rz(Theta_Swing / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Swing_Ending = SE3_T(Zero2Swing_Ending_PosX, -Zero2Swing_Ending_PosY, -Zero2Swing_Ending_PosZ);
		Position2Swing_Ending.LH = MatrixMultiply(2, Position2Zero.LH, Zero2Swing_Ending);
		Plane2Swing_Ending.LH = MatrixMultiply(2, Plane2Position, Position2Swing_Ending.LH);
		Body2Swing_Ending.LH = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Swing_Ending.LH);
		free(Zero2Swing_Ending.pMatrix);
		free(Position2Swing_Ending.LH.pMatrix);
		free(Plane2Swing_Ending.LH.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.LH);
		Leg2Swing_Ending.LH = MatrixMultiply(2, InverseMatrix, Body2Swing_Ending.LH);
		free(InverseMatrix.pMatrix);
		free(Body2Swing_Ending.LH.pMatrix);

		*(ResultArray + 3 * 3 + 0) = *(Leg2Swing_Ending.LH.pMatrix + 0 * 4 + 3);
		*(ResultArray + 3 * 3 + 1) = *(Leg2Swing_Ending.LH.pMatrix + 1 * 4 + 3);
		*(ResultArray + 3 * 3 + 2) = *(Leg2Swing_Ending.LH.pMatrix + 2 * 4 + 3);

		free(Leg2Swing_Ending.LH.pMatrix);
	}

	t = sRobot_MotionPara.Phase_RH / sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.Cycle;
	if (sRobot_MotionPara.Phase_RH < sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio)
	{
		Zero2Supporting_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosX = sRobot_MotionPara.Span_X / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosY = 0 * t;
		Theta_Supporting = sRobot_MotionPara.Span_W * (1 - 4 * t / sRobot_MotionPara.Cycle);

		MatrixRotation_Z = SE3_Rz(Theta_Supporting / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Supporting_Ending = SE3_T(-Zero2Supporting_Ending_PosX, Zero2Supporting_Ending_PosY, -Zero2Supporting_Ending_PosZ);
		Position2Supporting_Ending.RH = MatrixMultiply(2, Position2Zero.RH, Zero2Supporting_Ending);
		Plane2Supporting_Ending.RH = MatrixMultiply(2, Plane2Position, Position2Supporting_Ending.RH);
		Body2Supporting_Ending.RH = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Supporting_Ending.RH);
		free(Zero2Supporting_Ending.pMatrix);
		free(Position2Supporting_Ending.RH.pMatrix);
		free(Plane2Supporting_Ending.RH.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.RH);
		Leg2Supporting_Ending.RH = MatrixMultiply(2, InverseMatrix, Body2Supporting_Ending.RH);
		free(InverseMatrix.pMatrix);
		free(Body2Supporting_Ending.RH.pMatrix);

		*(ResultArray + 1 * 3 + 0) = *(Leg2Supporting_Ending.RH.pMatrix + 0 * 4 + 3);
		*(ResultArray + 1 * 3 + 1) = *(Leg2Supporting_Ending.RH.pMatrix + 1 * 4 + 3);
		*(ResultArray + 1 * 3 + 2) = *(Leg2Supporting_Ending.RH.pMatrix + 2 * 4 + 3);

		free(Leg2Supporting_Ending.RH.pMatrix);
	}
	else
	{
		Zero2Swing_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * polyval(Coeff_X.pMatrix, 4, (t - SupportingTime_Walk));
		Zero2Swing_Ending_PosX = sRobot_MotionPara.Span_X / 2 * polyval(Coeff_Y.pMatrix, 4, (t - SupportingTime_Walk));
		Zero2Swing_Ending_PosY = sRobot_MotionPara.Span_Y * (1 - cos(2 * PI * (t - SupportingTime_Walk) / SwingTime_Walk)) / 2;
		Theta_Swing = sRobot_MotionPara.Span_W * polyval(Coeff_W.pMatrix, 4, (t - SupportingTime_Walk));

		MatrixRotation_Z = SE3_Rz(Theta_Swing / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Swing_Ending = SE3_T(-Zero2Swing_Ending_PosX, Zero2Swing_Ending_PosY, -Zero2Swing_Ending_PosZ);
		Position2Swing_Ending.RH = MatrixMultiply(2, Position2Zero.RH, Zero2Swing_Ending);
		Plane2Swing_Ending.RH = MatrixMultiply(2, Plane2Position, Position2Swing_Ending.RH);
		Body2Swing_Ending.RH = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Swing_Ending.RH);
		free(Zero2Swing_Ending.pMatrix);
		free(Position2Swing_Ending.RH.pMatrix);
		free(Plane2Swing_Ending.RH.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.RH);
		Leg2Swing_Ending.RH = MatrixMultiply(2, InverseMatrix, Body2Swing_Ending.RH);
		free(InverseMatrix.pMatrix);
		free(Body2Swing_Ending.RH.pMatrix);

		*(ResultArray + 1 * 3 + 0) = *(Leg2Swing_Ending.RH.pMatrix + 0 * 4 + 3);
		*(ResultArray + 1 * 3 + 1) = *(Leg2Swing_Ending.RH.pMatrix + 1 * 4 + 3);
		*(ResultArray + 1 * 3 + 2) = *(Leg2Swing_Ending.RH.pMatrix + 2 * 4 + 3);

		free(Leg2Swing_Ending.RH.pMatrix);
	}

	t = sRobot_MotionPara.Phase_RF / sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.Cycle;
	if (sRobot_MotionPara.Phase_RF < sRobot_MotionPara.PhaseTotal * sRobot_MotionPara.DutyRatio)
	{
		Zero2Supporting_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosX = sRobot_MotionPara.Span_X / 2 * (1 - 4 * t / sRobot_MotionPara.Cycle);
		Zero2Supporting_Ending_PosY = 0 * t;
		Theta_Supporting = sRobot_MotionPara.Span_W * (1 - 4 * t / sRobot_MotionPara.Cycle);

		MatrixRotation_Z = SE3_Rz(Theta_Supporting / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Supporting_Ending = SE3_T(-Zero2Supporting_Ending_PosX, -Zero2Supporting_Ending_PosY, Zero2Supporting_Ending_PosZ);
		Position2Supporting_Ending.RF = MatrixMultiply(2, Position2Zero.RF, Zero2Supporting_Ending);
		Plane2Supporting_Ending.RF = MatrixMultiply(2, Plane2Position, Position2Supporting_Ending.RF);
		Body2Supporting_Ending.RF = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Supporting_Ending.RF);
		free(Zero2Supporting_Ending.pMatrix);
		free(Position2Supporting_Ending.RF.pMatrix);
		free(Plane2Supporting_Ending.RF.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.RF);
		Leg2Supporting_Ending.RF = MatrixMultiply(2, InverseMatrix, Body2Supporting_Ending.RF);
		free(InverseMatrix.pMatrix);
		free(Body2Supporting_Ending.RF.pMatrix);

		*(ResultArray + 2 * 3 + 0) = *(Leg2Supporting_Ending.RF.pMatrix + 0 * 4 + 3);
		*(ResultArray + 2 * 3 + 1) = *(Leg2Supporting_Ending.RF.pMatrix + 1 * 4 + 3);
		*(ResultArray + 2 * 3 + 2) = *(Leg2Supporting_Ending.RF.pMatrix + 2 * 4 + 3);

		free(Leg2Supporting_Ending.RF.pMatrix);
	}
	else
	{
		Zero2Swing_Ending_PosZ = sRobot_MotionPara.Span_Z / 2 * polyval(Coeff_X.pMatrix, 4, (t - SupportingTime_Walk));
		Zero2Swing_Ending_PosX = sRobot_MotionPara.Span_X / 2 * polyval(Coeff_Y.pMatrix, 4, (t - SupportingTime_Walk));
		Zero2Swing_Ending_PosY = sRobot_MotionPara.Span_Y * (1 - cos(2 * PI * (t - SupportingTime_Walk) / SwingTime_Walk)) / 2;
		Theta_Swing = sRobot_MotionPara.Span_W * polyval(Coeff_W.pMatrix, 4, (t - SupportingTime_Walk));

		MatrixRotation_Z = SE3_Rz(Theta_Swing / PI * 180);
		InverseMatrix = Inv4(Plane2Body);

		Zero2Swing_Ending = SE3_T(-Zero2Swing_Ending_PosX, -Zero2Swing_Ending_PosY, Zero2Swing_Ending_PosZ);
		Position2Swing_Ending.RF = MatrixMultiply(2, Position2Zero.RF, Zero2Swing_Ending);
		Plane2Swing_Ending.RF = MatrixMultiply(2, Plane2Position, Position2Swing_Ending.RF);
		Body2Swing_Ending.RF = MatrixMultiply(3, MatrixRotation_Z, InverseMatrix, Plane2Swing_Ending.RF);
		free(Zero2Swing_Ending.pMatrix);
		free(Position2Swing_Ending.RF.pMatrix);
		free(Plane2Swing_Ending.RF.pMatrix);

		free(MatrixRotation_Z.pMatrix);
		free(InverseMatrix.pMatrix);

		InverseMatrix = Inv4(Body2Leg.RF);
		Leg2Swing_Ending.RF = MatrixMultiply(2, InverseMatrix, Body2Swing_Ending.RF);
		free(InverseMatrix.pMatrix);
		free(Body2Swing_Ending.RF.pMatrix);

		*(ResultArray + 2 * 3 + 0) = *(Leg2Swing_Ending.RF.pMatrix + 0 * 4 + 3);
		*(ResultArray + 2 * 3 + 1) = *(Leg2Swing_Ending.RF.pMatrix + 1 * 4 + 3);
		*(ResultArray + 2 * 3 + 2) = *(Leg2Swing_Ending.RF.pMatrix + 2 * 4 + 3);

		free(Leg2Swing_Ending.RF.pMatrix);
	}

	return Arr2Mat(ResultArray, 4, 3);
}